

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O3

void __thiscall
Js::WebAssemblyEnvironment::SetGlobalInternal<float>
          (WebAssemblyEnvironment *this,uint32 offset,float val)

{
  float *pfVar1;
  WriteBarrierPtr<void> *pWVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  pWVar2 = (this->start).ptr;
  pfVar1 = (float *)((long)&pWVar2->ptr + (ulong)offset * 4);
  if (((long)pWVar2 <= (long)pfVar1) && ((long)(pfVar1 + 1) <= (long)(this->end).ptr)) {
    if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                  ,0x93,"(*ptr == 0)",
                                  "We shouldn\'t overwrite anything on the environment once it is set"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    *pfVar1 = val;
    return;
  }
  Throw::InternalError();
}

Assistant:

void WebAssemblyEnvironment::SetGlobalInternal(uint32 offset, T val)
{
    Field(T)* ptr = (Field(T)*)PointerValue(start) + offset;
    CheckPtrIsValid<T>((intptr_t)PointerValue(ptr));
    AssertMsg(*ptr == 0, "We shouldn't overwrite anything on the environment once it is set");
    *ptr = val;
}